

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::Next
          (CopyingInputStreamAdaptor *this,void **data,int *size)

{
  undefined4 uVar1;
  pointer puVar2;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  CopyingInputStreamAdaptor *in_stack_00000030;
  CopyingInputStreamAdaptor *in_stack_ffffffffffffffd0;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *this_00;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
    AllocateBufferIfNeeded(in_stack_ffffffffffffffd0);
    if (*(int *)(in_RDI + 0x30) < 1) {
      this_00 = *(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> **)(in_RDI + 8)
      ;
      puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get(this_00)
      ;
      uVar1 = (**(code **)((this_00->_M_t).
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x10))
                        (this_00,puVar2,*(undefined4 *)(in_RDI + 0x28));
      *(undefined4 *)(in_RDI + 0x2c) = uVar1;
      if (*(int *)(in_RDI + 0x2c) < 1) {
        if (*(int *)(in_RDI + 0x2c) < 0) {
          *(undefined1 *)(in_RDI + 0x11) = 1;
        }
        FreeBuffer(in_stack_00000030);
        local_1 = false;
      }
      else {
        *(long *)(in_RDI + 0x18) = (long)*(int *)(in_RDI + 0x2c) + *(long *)(in_RDI + 0x18);
        *in_RDX = *(undefined4 *)(in_RDI + 0x2c);
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           (this_00);
        *in_RSI = puVar2;
        local_1 = true;
      }
    }
    else {
      puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_stack_ffffffffffffffd0);
      *in_RSI = puVar2 + ((long)*(int *)(in_RDI + 0x2c) - (long)*(int *)(in_RDI + 0x30));
      *in_RDX = *(undefined4 *)(in_RDI + 0x30);
      *(undefined4 *)(in_RDI + 0x30) = 0;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CopyingInputStreamAdaptor::Next(const void** data, int* size) {
  if (failed_) {
    // Already failed on a previous read.
    return false;
  }

  AllocateBufferIfNeeded();

  if (backup_bytes_ > 0) {
    // We have data left over from a previous BackUp(), so just return that.
    *data = buffer_.get() + buffer_used_ - backup_bytes_;
    *size = backup_bytes_;
    backup_bytes_ = 0;
    return true;
  }

  // Read new data into the buffer.
  buffer_used_ = copying_stream_->Read(buffer_.get(), buffer_size_);
  if (buffer_used_ <= 0) {
    // EOF or read error.  We don't need the buffer anymore.
    if (buffer_used_ < 0) {
      // Read error (not EOF).
      failed_ = true;
    }
    FreeBuffer();
    return false;
  }
  position_ += buffer_used_;

  *size = buffer_used_;
  *data = buffer_.get();
  return true;
}